

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O1

int StartThreadPololux(POLOLU *pPololu)

{
  int iVar1;
  int iVar2;
  long lVar3;
  THREAD_IDENTIFIER *pThreadId;
  CRITICAL_SECTION *__mutex;
  pthread_mutexattr_t attr;
  pthread_mutexattr_t local_2c;
  
  __mutex = PololuCS;
  pThreadId = PololuThreadId;
  lVar3 = 0;
  do {
    if (*(POLOLU **)((long)addrsPololu + lVar3 * 2) == pPololu) {
      *(undefined4 *)((long)resPololu + lVar3) = 1;
      *(undefined4 *)((long)bExitPololu + lVar3) = 0;
      iVar1 = pthread_mutexattr_init(&local_2c);
      if (iVar1 == 0) {
        iVar1 = pthread_mutexattr_settype(&local_2c,1);
        if (iVar1 == 0) {
          iVar1 = pthread_mutex_init((pthread_mutex_t *)__mutex,&local_2c);
          iVar2 = pthread_mutexattr_destroy(&local_2c);
          if ((iVar1 == 0) && (iVar2 != 0)) {
            pthread_mutex_destroy((pthread_mutex_t *)__mutex);
          }
        }
        else {
          pthread_mutexattr_destroy(&local_2c);
        }
      }
      iVar1 = CreateDefaultThread(PololuThread,pPololu,pThreadId);
      return iVar1;
    }
    lVar3 = lVar3 + 4;
    __mutex = __mutex + 1;
    pThreadId = pThreadId + 1;
  } while (lVar3 != 0x40);
  return 1;
}

Assistant:

HARDWAREX_API int StartThreadPololux(POLOLU* pPololu)
{
	int id = 0;

	while (addrsPololu[id] != pPololu)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	resPololu[id] = EXIT_FAILURE;
	bExitPololu[id] = FALSE;
	InitCriticalSection(&PololuCS[id]);
	return CreateDefaultThread(PololuThread, (void*)pPololu, &PololuThreadId[id]);
}